

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O2

ostream * clara::TextFlow::operator<<(ostream *os,Columns *cols)

{
  bool bVar1;
  bool bVar2;
  iterator __begin2;
  string line;
  iterator __end2;
  iterator local_a0;
  string local_78;
  iterator local_58;
  
  Columns::iterator::iterator(&local_a0,cols);
  Columns::iterator::iterator(&local_58,cols);
  bVar2 = true;
  while( true ) {
    bVar1 = std::operator!=(&local_a0.m_iterators,&local_58.m_iterators);
    if (!bVar1) break;
    Columns::iterator::operator*[abi_cxx11_(&local_78,&local_a0);
    if (!bVar2) {
      std::operator<<(os,"\n");
    }
    std::operator<<(os,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    bVar2 = false;
    Columns::iterator::operator++(&local_a0);
  }
  std::
  _Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ::~_Vector_base(&local_58.m_iterators.
                   super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
                 );
  std::
  _Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
  ::~_Vector_base(&local_a0.m_iterators.
                   super__Vector_base<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
                 );
  return os;
}

Assistant:

inline friend std::ostream& operator << ( std::ostream& os, Columns const& cols ) {

            bool first = true;
            for( auto line : cols ) {
                if( first )
                    first = false;
                else
                    os << "\n";
                os << line;
            }
            return os;
        }